

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_embedded_struct_array_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t size,size_t count,flatcc_json_printer_struct_f *pf)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ulong __n;
  size_t __n_00;
  
  if (index != 0) {
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + 1;
    *pcVar3 = ',';
  }
  print_name(ctx,name,len);
  ctx->level = ctx->level + 1;
  pcVar3 = ctx->p;
  ctx->p = pcVar3 + 1;
  *pcVar3 = '[';
  if (count != 0) {
    sVar2 = 0;
    do {
      if (sVar2 != 0) {
        pcVar3 = ctx->p;
        ctx->p = pcVar3 + 1;
        *pcVar3 = ',';
      }
      ctx->level = ctx->level + 1;
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = '{';
      (*pf)(ctx,(void *)((long)p + sVar2 * size + offset));
      if (ctx->indent != '\0') {
        pcVar3 = ctx->p;
        ctx->p = pcVar3 + 1;
        *pcVar3 = '\n';
        lVar1 = (long)ctx->level + -1;
        ctx->level = (int)lVar1;
        __n = (ulong)ctx->indent * lVar1;
        pcVar3 = ctx->p;
        if (ctx->pflush < pcVar3 + __n) {
          if (ctx->pflush <= pcVar3) {
            (*ctx->flush)(ctx,0);
          }
          sVar4 = (long)ctx->pflush - (long)ctx->p;
          if (sVar4 < __n) {
            do {
              memset(ctx->p,0x20,sVar4);
              ctx->p = ctx->p + sVar4;
              __n = __n - sVar4;
              (*ctx->flush)(ctx,0);
              sVar4 = (long)ctx->pflush - (long)ctx->p;
            } while (sVar4 < __n);
          }
          memset(ctx->p,0x20,__n);
        }
        else {
          memset(pcVar3,0x20,__n);
        }
        ctx->p = ctx->p + __n;
      }
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = '}';
      sVar2 = sVar2 + 1;
    } while (sVar2 != count);
  }
  if (ctx->indent != '\0') {
    pcVar3 = ctx->p;
    ctx->p = pcVar3 + 1;
    *pcVar3 = '\n';
    lVar1 = (long)ctx->level + -1;
    ctx->level = (int)lVar1;
    sVar4 = (ulong)ctx->indent * lVar1;
    pcVar3 = ctx->p;
    if (ctx->pflush < pcVar3 + sVar4) {
      if (ctx->pflush <= pcVar3) {
        (*ctx->flush)(ctx,0);
      }
      __n_00 = (long)ctx->pflush - (long)ctx->p;
      if (__n_00 < sVar4) {
        do {
          memset(ctx->p,0x20,__n_00);
          ctx->p = ctx->p + __n_00;
          sVar4 = sVar4 - __n_00;
          (*ctx->flush)(ctx,0);
          __n_00 = (long)ctx->pflush - (long)ctx->p;
        } while (__n_00 < sVar4);
      }
      pcVar3 = ctx->p;
    }
    memset(pcVar3,0x20,sVar4);
    ctx->p = ctx->p + sVar4;
  }
  pcVar3 = ctx->p;
  ctx->p = pcVar3 + 1;
  *pcVar3 = ']';
  return;
}

Assistant:

void flatcc_json_printer_embedded_struct_array_field(flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len,
        size_t size, size_t count,
        flatcc_json_printer_struct_f pf)
{
    size_t i;
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('[');
    for (i = 0; i < count; ++i) {
        if (i > 0) {
            print_char(',');
        }
        print_start('{');                                                   \
        pf(ctx, (uint8_t *)p + offset + i * size);
        print_end('}');
    }
    print_end(']');
}